

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

int ON_Material::CompareTextureAttributesAppearance(ON_Material *a,ON_Material *b)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int i;
  long lVar4;
  
  iVar1 = (a->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
  iVar2 = iVar1 - (b->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
  lVar3 = 0;
  lVar4 = 0;
  while ((lVar4 < iVar1 && (iVar2 == 0))) {
    iVar2 = ON_Texture::CompareAppearance
                      ((ON_Texture *)
                       ((long)&((ON_Texture *)
                               (&((ON_Texture *)
                                 (&((ON_Texture *)
                                   (&((a->m_textures).super_ON_ClassArray<ON_Texture>.m_a)->
                                     m_texture_id + -1))->m_texture_id + -1))->m_texture_id + -1))->
                               m_texture_id + lVar3 + 0xfffffffffffffff0U),
                       (ON_Texture *)
                       ((long)&((ON_Texture *)
                               (&((ON_Texture *)
                                 (&((ON_Texture *)
                                   (&((b->m_textures).super_ON_ClassArray<ON_Texture>.m_a)->
                                     m_texture_id + -1))->m_texture_id + -1))->m_texture_id + -1))->
                               m_texture_id + lVar3 + 0xfffffffffffffff0U));
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x200;
  }
  iVar1 = (uint)a->m_bUseDiffuseTextureAlphaForObjectTransparencyTexture -
          (uint)b->m_bUseDiffuseTextureAlphaForObjectTransparencyTexture;
  if (iVar2 != 0) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

int ON_Material::CompareTextureAttributesAppearance(const ON_Material& a, const ON_Material& b)
{
  // do NOT test index or id

  const int tcount = a.m_textures.Count();
  int rc = tcount - b.m_textures.Count();
  for (int i = 0; i < tcount && 0 == rc; i++)
  {
    rc = ON_Texture::CompareAppearance(a.m_textures[i], b.m_textures[i]);
  }
  if (0 == rc)
    rc = ((int)a.m_bUseDiffuseTextureAlphaForObjectTransparencyTexture) - ((int)b.m_bUseDiffuseTextureAlphaForObjectTransparencyTexture);


  return rc;
}